

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O3

Sbd_Sto_t *
Sbd_StoAlloc(Gia_Man_t *pGia,Vec_Int_t *vMirrors,int nLutSize,int nCutSize,int nCutNum,int fCutMin,
            int fVerbose)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  Sbd_Sto_t *pSVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Wec_t *pVVar7;
  word *pEntry;
  Vec_Mem_t *p;
  abctime aVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  timespec ts;
  timespec local_40;
  
  if (nCutSize < nLutSize) {
    __assert_fail("nLutSize <= nCutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x29e,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if (0xe < nCutSize) {
    __assert_fail("nCutSize < SBD_CUT_NO_LEAF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x29f,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if (8 < nCutSize - 2U) {
    __assert_fail("nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x2a0,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if (0x1f2 < nCutNum - 2U) {
    __assert_fail("nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x2a1,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  pSVar4 = (Sbd_Sto_t *)calloc(1,0x187f8);
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    aVar8 = -1;
  }
  else {
    aVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pSVar4->clkStart = aVar8;
  pSVar4->nLutSize = nLutSize;
  pSVar4->nCutSize = nCutSize;
  pSVar4->nCutNum = nCutNum;
  pSVar4->fCutMin = fCutMin;
  pSVar4->fVerbose = fVerbose;
  pSVar4->pGia = pGia;
  pSVar4->vMirrors = vMirrors;
  iVar2 = pGia->nObjs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar11 = iVar2;
  }
  pVVar5->nCap = iVar11;
  if (iVar11 == 0) {
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = iVar2;
    pSVar4->vDelays = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 0;
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = iVar2;
  }
  else {
    sVar1 = (long)iVar11 * 4;
    piVar6 = (int *)malloc(sVar1);
    pVVar5->pArray = piVar6;
    pVVar5->nSize = iVar2;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0,(long)iVar2 * 4);
    }
    pSVar4->vDelays = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = iVar11;
    piVar6 = (int *)malloc(sVar1);
    pVVar5->pArray = piVar6;
    pVVar5->nSize = iVar2;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0,(long)iVar2 << 2);
    }
  }
  pSVar4->vLevels = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar11;
  if (iVar11 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar5->pArray = piVar6;
  pSVar4->vRefs = pVVar5;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar2 - 1U) {
    iVar11 = iVar2;
  }
  pVVar7->nCap = iVar11;
  if (iVar11 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar11,0x10);
  }
  pVVar7->pArray = pVVar5;
  pVVar7->nSize = iVar2;
  pSVar4->vCuts = pVVar7;
  if (fCutMin == 0) {
    p = (Vec_Mem_t *)0x0;
  }
  else {
    uVar10 = 1 << ((char)nCutSize - 6U & 0x1f);
    if ((uint)nCutSize < 7) {
      uVar10 = 1;
    }
    sVar1 = (ulong)uVar10 * 8;
    pEntry = (word *)malloc(sVar1);
    p = (Vec_Mem_t *)calloc(1,0x30);
    p->nEntrySize = uVar10;
    p->LogPageSze = 0xc;
    p->PageMask = 0xfff;
    p->iPage = -1;
    uVar10 = 9999;
    while( true ) {
      do {
        uVar9 = uVar10;
        uVar10 = uVar9 + 1;
      } while ((uVar9 & 1) != 0);
      if (uVar10 < 9) break;
      iVar2 = 5;
      while (uVar10 % (iVar2 - 2U) != 0) {
        uVar3 = iVar2 * iVar2;
        iVar2 = iVar2 + 2;
        if (uVar10 < uVar3) goto LAB_0054acda;
      }
    }
LAB_0054acda:
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    uVar3 = 0x10;
    if (0xe < uVar9) {
      uVar3 = uVar10;
    }
    pVVar5->nCap = uVar3;
    piVar6 = (int *)malloc((long)(int)uVar3 << 2);
    pVVar5->pArray = piVar6;
    pVVar5->nSize = uVar10;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0xff,(long)(int)uVar10 << 2);
    }
    p->vTable = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 10000;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(40000);
    pVVar5->pArray = piVar6;
    p->vNexts = pVVar5;
    memset(pEntry,0,sVar1);
    iVar2 = Vec_MemHashInsert(p,pEntry);
    if (iVar2 != 0) {
      __assert_fail("Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                    ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    memset(pEntry,0xaa,sVar1);
    iVar2 = Vec_MemHashInsert(p,pEntry);
    if (iVar2 != 1) {
      __assert_fail("Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                    ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    if (pEntry != (word *)0x0) {
      free(pEntry);
    }
  }
  pSVar4->vTtMem = p;
  return pSVar4;
}

Assistant:

Sbd_Sto_t * Sbd_StoAlloc( Gia_Man_t * pGia, Vec_Int_t * vMirrors, int nLutSize, int nCutSize, int nCutNum, int fCutMin, int fVerbose )
{
    Sbd_Sto_t * p;
    assert( nLutSize <= nCutSize );
    assert( nCutSize < SBD_CUT_NO_LEAF );
    assert( nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE );
    assert( nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM );
    p = ABC_CALLOC( Sbd_Sto_t, 1 );
    p->clkStart = Abc_Clock();
    p->nLutSize = nLutSize;
    p->nCutSize = nCutSize;
    p->nCutNum  = nCutNum;
    p->fCutMin  = fCutMin;
    p->fVerbose = fVerbose;
    p->pGia     = pGia;
    p->vMirrors = vMirrors;
    p->vDelays  = Vec_IntStart( Gia_ManObjNum(pGia) );
    p->vLevels  = Vec_IntStart( Gia_ManObjNum(pGia) );
    p->vRefs    = Vec_IntAlloc( Gia_ManObjNum(pGia) );
    p->vCuts    = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->vTtMem   = fCutMin ? Vec_MemAllocForTT( nCutSize, 0 ) : NULL;
    return p;
}